

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

void * btreeblk_move(void *voidhandle,bid_t bid,bid_t *new_bid)

{
  bid_t *pbVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int sb_no;
  long lVar10;
  bid_t _new_bid;
  void *local_58;
  bid_t local_38;
  
  if ((char)(bid >> 0x30) == '\0') {
    pvVar4 = _btreeblk_read(voidhandle,bid,-1);
    local_58 = _btreeblk_alloc(voidhandle,new_bid,-1);
    *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
    memcpy(local_58,pvVar4,(ulong)*voidhandle);
    filemgr_add_stale_block
              (*(filemgr **)((long)voidhandle + 0x38),bid * *voidhandle,(ulong)*voidhandle);
  }
  else {
    lVar10 = (ulong)((uint)(bid >> 0x35) & 7) - 1;
    sb_no = (int)lVar10;
    pvVar4 = _btreeblk_read(voidhandle,bid & 0xffffffffffff,sb_no);
    pbVar1 = (bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar10 * 0x18);
    uVar5 = (ulong)*(ushort *)((long)pbVar1 + 0xc);
    uVar9 = uVar5;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if (*(char *)(pbVar1[2] + uVar8) == '\0') break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar5;
      } while (uVar5 != uVar8);
    }
    uVar8 = (ulong)((ushort)(bid >> 0x30) & 0x1f);
    if (((*pbVar1 == 0xffffffffffffffff) || (uVar9 == uVar5)) ||
       (iVar3 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),*pbVar1), iVar3 == 0)) {
      if ((*(long *)(*(long *)((long)voidhandle + 0x60) + lVar10 * 0x18) != -1) &&
         (*(short *)(*(long *)((long)voidhandle + 0x60) + 0xc + lVar10 * 0x18) != 0)) {
        plVar6 = (long *)(*(long *)((long)voidhandle + 0x60) + lVar10 * 0x18);
        uVar9 = 0;
        do {
          if (*(char *)(plVar6[2] + uVar9) == '\0') {
            filemgr_add_stale_block
                      (*(filemgr **)((long)voidhandle + 0x38),
                       (ulong)((int)uVar9 * *(uint *)(plVar6 + 1)) + (ulong)*voidhandle * *plVar6,
                       (ulong)*(uint *)(plVar6 + 1));
          }
          uVar9 = uVar9 + 1;
          plVar6 = (long *)(*(long *)((long)voidhandle + 0x60) + lVar10 * 0x18);
        } while (uVar9 < *(ushort *)((long)plVar6 + 0xc));
      }
      local_58 = _btreeblk_alloc(voidhandle,&local_38,sb_no);
      *(long *)((long)voidhandle + 8) = *(long *)((long)voidhandle + 8) + -1;
      lVar2 = *(long *)((long)voidhandle + 0x60);
      *(bid_t *)(lVar2 + lVar10 * 0x18) = local_38;
      uVar9 = 0;
      memset(*(void **)(lVar2 + 0x10 + lVar10 * 0x18),0,
             (ulong)*(ushort *)(lVar2 + 0xc + lVar10 * 0x18));
    }
    else {
      local_58 = _btreeblk_read(voidhandle,
                                *(bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar10 * 0x18),sb_no
                               );
    }
    lVar10 = lVar10 * 0x18;
    *(undefined1 *)(*(long *)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar10) + uVar9) = 1;
    lVar2 = *(long *)((long)voidhandle + 0x60);
    *new_bid = (ulong)(sb_no * 0x20 + 0x20U | (uint)uVar9) << 0x30 | *(ulong *)(lVar2 + lVar10);
    for (lVar7 = *(long *)((long)voidhandle + 0x28); lVar7 != 0; lVar7 = *(long *)(lVar7 + 8)) {
      if (*(ulong *)(lVar7 + -0x20) ==
          (*(ulong *)(lVar2 + lVar10) & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4))
      {
        *(undefined1 *)(lVar7 + -0x10) = 1;
        break;
      }
    }
    uVar5 = (ulong)*(uint *)(lVar2 + 8 + lVar10);
    memcpy((void *)(uVar9 * uVar5 + (long)local_58),(void *)((long)pvVar4 + uVar8 * uVar5),uVar5);
    uVar5 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar10);
    filemgr_add_stale_block
              (*(filemgr **)((long)voidhandle + 0x38),
               uVar8 * uVar5 + (bid & 0xffffffffffff) * (ulong)*voidhandle,uVar5);
    local_58 = (void *)(*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar10) * uVar9 +
                       (long)local_58);
  }
  return local_58;
}

Assistant:

void * btreeblk_move(void *voidhandle, bid_t bid, bid_t *new_bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    void *old_addr, *new_addr;
    bid_t _old_bid, _new_bid;
    int i, subblock;
    size_t sb, old_sb_idx, new_sb_idx;

    old_addr = new_addr = NULL;
    sb = old_sb_idx = 0;
    subbid2bid(bid, &sb, &old_sb_idx, &_old_bid);
    subblock = is_subblock(bid);

    int convert_to_normal = 0;
#ifndef __BTREEBLK_SUBBLOCK
    convert_to_normal = 1;
#endif

    if (!subblock) {
        // normal block
        old_addr = btreeblk_read(voidhandle, bid);
        new_addr = btreeblk_alloc(voidhandle, new_bid);
        handle->nlivenodes--;

        // move
        memcpy(new_addr, old_addr, (handle->nodesize));

        // the entire block becomes stale
        _btreeblk_add_stale_block(handle, bid * handle->nodesize, handle->nodesize);

        return new_addr;
    } else {
        // subblock

        // move the target subblock
        // into the current subblock set
        old_addr = _btreeblk_read(voidhandle, _old_bid, sb);

        new_sb_idx = handle->sb[sb].nblocks;
        for (i=0;i<handle->sb[sb].nblocks;++i){
            if (handle->sb[sb].bitmap[i] == 0) {
                new_sb_idx = i;
                break;
            }
        }
        if ( handle->sb[sb].bid == BLK_NOT_FOUND ||
             new_sb_idx == handle->sb[sb].nblocks ||
             !filemgr_is_writable(handle->file, handle->sb[sb].bid) ||
             convert_to_normal ) {
            // There is no free slot in the parent block, OR
            // the parent block is not writable, OR
            // `convert_to_normal` flag is on.

            // Mark all unused subblocks in the current parent block as stale
            if (handle->sb[sb].bid != BLK_NOT_FOUND) {
                for (i=0; i<handle->sb[sb].nblocks; ++i) {
                    if (handle->sb[sb].bitmap[i] == 0) {
                        _btreeblk_add_stale_block
                        ( handle,
                          ( (handle->sb[sb].bid * handle->nodesize) +
                            (i * handle->sb[sb].sb_size) ),
                          handle->sb[sb].sb_size );
                    }
                }
            }

            if (convert_to_normal) {
                // Whole block.
                new_addr = btreeblk_alloc(voidhandle, &_new_bid);
                handle->nlivenodes--;
            } else {
                // Allocate new parent block.
                new_addr = _btreeblk_alloc(voidhandle, &_new_bid, sb);
                handle->nlivenodes--;
                handle->sb[sb].bid = _new_bid;
                memset(handle->sb[sb].bitmap, 0, handle->sb[sb].nblocks);
            }
            new_sb_idx = 0;

        } else {
            // just append to the current block
            new_addr = _btreeblk_read(voidhandle, handle->sb[sb].bid, sb);
        }

        if (convert_to_normal) {
            *new_bid = _new_bid;
        } else {
            handle->sb[sb].bitmap[new_sb_idx] = 1;
            bid2subbid(handle->sb[sb].bid, sb, new_sb_idx, new_bid);
            btreeblk_set_dirty(voidhandle, handle->sb[sb].bid);
        }

        // move
        memcpy( (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx,
                (uint8_t*)old_addr + handle->sb[sb].sb_size * old_sb_idx,
                handle->sb[sb].sb_size );

        // Also mark the target (old) subblock as stale
        _btreeblk_add_stale_block
        ( handle,
          (_old_bid * handle->nodesize) + (old_sb_idx * handle->sb[sb].sb_size),
           handle->sb[sb].sb_size );

        return (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx;
    }
}